

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_match(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *this;
  uint uVar1;
  re_compiled_pattern *pattern;
  vm_globalvar_t *pvVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  ushort *puVar9;
  size_t sVar10;
  CVmObjPageEntry *pCVar11;
  uint uVar12;
  int iVar13;
  ulong bytecnt;
  ulong __n;
  char *p;
  utf8_ptr searchstr;
  size_t len;
  utf8_ptr strp;
  
  if (argc == (uint *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = *argc;
  }
  if ((getp_match(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar6 = __cxa_guard_acquire(&getp_match(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar6 != 0)) {
    getp_match::desc.min_argc_ = 1;
    getp_match::desc.opt_argc_ = 1;
    getp_match::desc.varargs_ = 0;
    __cxa_guard_release(&getp_match(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_match::desc);
  pvVar5 = sp_;
  if (iVar6 != 0) {
    return 1;
  }
  bytecnt = (ulong)*(ushort *)str;
  this = sp_ + -1;
  len = bytecnt;
  puVar9 = (ushort *)vm_val_t::get_as_string(this);
  if (puVar9 == (ushort *)0x0) {
    if ((this->typ != VM_OBJ) ||
       (uVar1 = pvVar5[-1].val.obj, uVar7 = uVar1 & 0xfff,
       iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar7].ptr_ + 8))
                         (G_obj_table_X.pages_[uVar1 >> 0xc] + uVar7,CVmObjPattern::metaclass_reg_),
       iVar6 == 0)) {
LAB_002a5801:
      err_throw(0x900);
    }
    uVar1 = pvVar5[-1].val.obj;
    if (G_obj_table_X.pages_[uVar1 >> 0xc] == (CVmObjPageEntry *)0x0) goto LAB_002a5801;
    pCVar11 = G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff);
    puVar9 = (ushort *)0x0;
    __n = 0;
  }
  else {
    __n = (ulong)*puVar9;
    puVar9 = puVar9 + 1;
    pCVar11 = (CVmObjPageEntry *)0x0;
  }
  p = str + 2;
  searchstr.p_ = p;
  if ((1 < uVar12) && (sp_[-2].typ != VM_NIL)) {
    iVar8 = vm_val_t::num_to_int(sp_ + -2);
    strp.p_ = p;
    if (iVar8 < 0) {
      sVar10 = utf8_ptr::s_len(p,bytecnt);
      iVar6 = (int)sVar10;
    }
    else {
      iVar6 = -1;
    }
    iVar13 = 0;
    while ((iVar13 < iVar6 + iVar8 && (__n < bytecnt))) {
      iVar13 = iVar13 + 1;
      utf8_ptr::inc(&strp,&len);
      bytecnt = len;
    }
    searchstr.p_ = strp.p_;
    if (iVar13 < iVar6 + iVar8) {
      retval->typ = VM_NIL;
      goto LAB_002a5703;
    }
  }
  if (puVar9 == (ushort *)0x0) {
    pattern = (re_compiled_pattern *)**(undefined8 **)((long)&pCVar11->ptr_ + 8);
    pvVar2 = G_bif_tads_globals_X->last_rex_str;
    uVar4 = *(undefined4 *)&self_val->field_0x4;
    aVar3 = self_val->val;
    (pvVar2->val).typ = self_val->typ;
    *(undefined4 *)&(pvVar2->val).field_0x4 = uVar4;
    (pvVar2->val).val = aVar3;
    CRegexSearcherSimple::clear_group_regs(G_bif_tads_globals_X->rex_searcher);
    iVar6 = CRegexSearcherSimple::match_pattern
                      (G_bif_tads_globals_X->rex_searcher,pattern,p,searchstr.p_,len);
    if (-1 < iVar6) {
      retval->typ = VM_INT;
      (retval->val).intval = iVar6;
      goto LAB_002a5703;
    }
  }
  else if ((__n <= bytecnt) && (iVar6 = bcmp(puVar9,searchstr.p_,__n), iVar6 == 0)) {
    retval->typ = VM_INT;
    (retval->val).obj = (vm_obj_id_t)__n;
    goto LAB_002a5703;
  }
  retval->typ = VM_NIL;
LAB_002a5703:
  sp_ = sp_ + -(long)(int)uVar12;
  return 1;
}

Assistant:

int CVmObjString::getp_match(VMG_ vm_val_t *retval,
                             const vm_val_t *self_val, const char *str,
                             uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the base string */
    const char *basestr = str;
    
    /* retrieve the string or regex pattern to match */
    vm_val_t *targ = G_stk->get(0);
    const char *targstr = 0;
    CVmObjPattern *targpat = 0;
    size_t targstrlen = 0;
    if ((targstr = targ->get_as_string(vmg0_)) != 0)
    {
        /* it's a literal string - get its length and text pointer */
        targstrlen = vmb_get_len(targstr);
        targstr += VMB_LEN;
    }
    else if ((targpat = vm_val_cast(CVmObjPattern, targ)) != 0)
    {
        /* it's a pattern */
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* retrieve the starting index, if present */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character. 
         */
        start_idx += (start_idx < 0 ? (int)strp.len(len) : -1);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > targstrlen ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }

    /* match the string or pattern */
    if (targstr != 0)
    {
        /* make sure it's long enough, then match the text literally */
        if (len >= targstrlen && memcmp(targstr, str, targstrlen) == 0)
        {
            /* matched - return the match length */
            retval->set_int(targstrlen);
        }
        else
        {
            /* no match */
            retval->set_nil();
        }
    }
    else
    {
        /* RexPattern - get the compiled pattern */
        re_compiled_pattern *cpat = targpat->get_pattern(vmg0_);

        /* save the last search source string */
        G_bif_tads_globals->last_rex_str->val = *self_val;
        G_bif_tads_globals->rex_searcher->clear_group_regs();

        /* match the pattern */
        int matchlen = G_bif_tads_globals->rex_searcher->match_pattern(
            cpat, basestr, str, len);

        /* if it matched (len >= 0), return the length, otherwise nil */
        if (matchlen >= 0)
            retval->set_int(matchlen);
        else
            retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}